

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O2

Time absl::FromUniversal(int64_t universal)

{
  undefined8 in_RCX;
  Duration DVar1;
  Duration DVar2;
  
  DVar1 = time_internal::FromInt64<1000000000l>();
  DVar2.rep_hi_ = DVar1._8_8_;
  DVar2._8_8_ = in_RCX;
  DVar2 = operator*((absl *)0x64,(int)DVar1.rep_hi_,DVar2);
  DVar1._8_8_ = DVar2._8_8_ & 0xffffffff;
  DVar1.rep_hi_ = DVar2.rep_hi_;
  DVar2 = (Duration)operator+((Time)ZEXT816(0xfffffff1886e0900),DVar1);
  return (Time)DVar2;
}

Assistant:

absl::Time FromUniversal(int64_t universal) {
  return absl::UniversalEpoch() + 100 * absl::Nanoseconds(universal);
}